

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

bool __thiscall
Memory::HeapPageAllocator<Memory::VirtualAllocWrapper>::CreateSecondaryAllocator
          (HeapPageAllocator<Memory::VirtualAllocWrapper> *this,
          SegmentBase<Memory::VirtualAllocWrapper> *segment,bool committed,
          SecondaryAllocator **allocator)

{
  PageAllocatorBaseCommon *pPVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  LPVOID pvVar6;
  HeapAllocator *this_00;
  XDataAllocator *this_01;
  AllocatorType *pAVar7;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  pPVar1 = (segment->super_SegmentBaseCommon).allocator;
  if (pPVar1 == (PageAllocatorBaseCommon *)0x0 ||
      (HeapPageAllocator<Memory::VirtualAllocWrapper> *)&pPVar1[-1].allocatorType != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xb34,"(segment->GetAllocator() == this)","segment->GetAllocator() == this")
    ;
    if (!bVar3) goto LAB_006fd480;
    *puVar5 = 0;
  }
  pPVar1 = (segment->super_SegmentBaseCommon).allocator;
  pAVar7 = &pPVar1[-1].allocatorType;
  if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
    pAVar7 = (AllocatorType *)0x0;
  }
  if (pAVar7[0x50] != 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xb35,"(segment->IsInCustomHeapAllocator())",
                       "segment->IsInCustomHeapAllocator()");
    if (!bVar3) goto LAB_006fd480;
    *puVar5 = 0;
  }
  if (this->allocXdata == false) {
    bVar3 = true;
    if ((segment->secondaryAllocPageCount & 0xfffff) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xb3c,"(segment->GetSecondaryAllocSize() == 0)",
                         "segment->GetSecondaryAllocSize() == 0");
      if (!bVar4) {
LAB_006fd480:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  else {
    if ((!committed) && ((segment->secondaryAllocPageCount & 0xfffff) != 0)) {
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::GetVirtualAllocator
                (&this->
                  super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                );
      pvVar6 = VirtualAllocWrapper::AllocPages
                         ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,
                          segment->address +
                          (segment->segmentPageCount - (ulong)segment->secondaryAllocPageCount) *
                          0x1000,(ulong)segment->secondaryAllocPageCount,0x1000,4,true);
      if (pvVar6 == (LPVOID)0x0) {
        this_01 = (XDataAllocator *)0x0;
        bVar3 = false;
        goto LAB_006fd463;
      }
    }
    local_58 = (undefined1  [8])&XDataAllocator::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2769ac2;
    data.filename._0_4_ = 0xb48;
    this_00 = HeapAllocator::TrackAllocInfo(&HeapAllocator::Instance,(TrackAllocData *)local_58);
    this_01 = (XDataAllocator *)HeapAllocator::AllocT<true>(this_00,0x28);
    XDataAllocator::XDataAllocator
              (this_01,(BYTE *)(segment->address +
                               (segment->segmentPageCount - (ulong)segment->secondaryAllocPageCount)
                               * 0x1000),segment->secondaryAllocPageCount << 0xc);
    bVar3 = XDataAllocator::Initialize
                      (this_01,segment->address,
                       segment->address +
                       (segment->segmentPageCount - (ulong)segment->secondaryAllocPageCount) *
                       0x1000);
    if (bVar3) goto LAB_006fd463;
    XDataAllocator::~XDataAllocator(this_01);
    HeapAllocator::Free(&HeapAllocator::Instance,this_01,0x28);
  }
  this_01 = (XDataAllocator *)0x0;
LAB_006fd463:
  *allocator = &this_01->super_SecondaryAllocator;
  return bVar3;
}

Assistant:

bool HeapPageAllocator<T>::CreateSecondaryAllocator(SegmentBase<T>* segment, bool committed, SecondaryAllocator** allocator)
{
    Assert(segment->GetAllocator() == this);
    Assert(segment->IsInCustomHeapAllocator());

    // If we are not allocating xdata there is nothing to do

    // ARM might allocate XDATA but not have a reserved region for it (no secondary alloc reserved space)
    if (!allocXdata)
    {
        Assert(segment->GetSecondaryAllocSize() == 0);
        *allocator = nullptr;
        return true;
    }

    if (!committed && segment->GetSecondaryAllocSize() != 0 &&
        !this->GetVirtualAllocator()->AllocPages(segment->GetSecondaryAllocStartAddress(), segment->GetSecondaryAllocPageCount(), MEM_COMMIT, PAGE_READWRITE, true))
    {
        *allocator = nullptr;
        return false;
    }

    XDataAllocator* secondaryAllocator = HeapNewNoThrow(XDataAllocator, (BYTE*)segment->GetSecondaryAllocStartAddress(), segment->GetSecondaryAllocSize());
    bool success = false;
    if (secondaryAllocator)
    {
        if (secondaryAllocator->Initialize((BYTE*)segment->GetAddress(), (BYTE*)segment->GetEndAddress()))
        {
            success = true;
        }
        else
        {
            HeapDelete(secondaryAllocator);
            secondaryAllocator = nullptr;
        }
    }
    *allocator = secondaryAllocator;
    return success;
}